

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ColorConvertRGBtoHSV(float r,float g,float b,float *out_h,float *out_s,float *out_v)

{
  undefined4 local_48;
  float chroma;
  float tmp_1;
  float tmp;
  float K;
  float *out_v_local;
  float *out_s_local;
  float *out_h_local;
  undefined4 local_10;
  float b_local;
  float g_local;
  float r_local;
  
  tmp_1 = 0.0;
  out_h_local._4_4_ = b;
  local_10 = g;
  if (g < b) {
    tmp_1 = -1.0;
    out_h_local._4_4_ = g;
    local_10 = b;
  }
  b_local = r;
  if (r < local_10) {
    b_local = local_10;
    tmp_1 = -0.33333334 - tmp_1;
    local_10 = r;
  }
  if (out_h_local._4_4_ <= local_10) {
    local_48 = out_h_local._4_4_;
  }
  else {
    local_48 = local_10;
  }
  *out_h = ABS(tmp_1 + (local_10 - out_h_local._4_4_) / ((b_local - local_48) * 6.0 + 1e-20));
  *out_s = (b_local - local_48) / (b_local + 1e-20);
  *out_v = b_local;
  return;
}

Assistant:

void ImGui::ColorConvertRGBtoHSV(float r, float g, float b, float& out_h, float& out_s, float& out_v)
{
    float K = 0.f;
    if (g < b)
    {
        const float tmp = g; g = b; b = tmp;
        K = -1.f;
    }
    if (r < g)
    {
        const float tmp = r; r = g; g = tmp;
        K = -2.f / 6.f - K;
    }

    const float chroma = r - (g < b ? g : b);
    out_h = fabsf(K + (g - b) / (6.f * chroma + 1e-20f));
    out_s = chroma / (r + 1e-20f);
    out_v = r;
}